

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

String * __thiscall
capnp::compiler::ValueTranslator::makeNodeName
          (String *__return_storage_ptr__,ValueTranslator *this,Schema schema)

{
  ulong uVar1;
  Reader RVar2;
  Reader proto;
  Schema local_58;
  char *local_50;
  StringPtr *local_48;
  Reader local_40;
  
  local_58.raw = schema.raw;
  Schema::getProto(&local_40,&local_58);
  RVar2 = capnp::schema::Node::Reader::getDisplayName(&local_40);
  if (local_40._reader.dataSize < 0x60) {
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)*(uint *)((long)local_40._reader.data + 8);
  }
  local_50 = RVar2.super_StringPtr.content.ptr + uVar1;
  local_48 = (StringPtr *)(RVar2.super_StringPtr.content.size_ - uVar1);
  kj::str<kj::StringPtr>(__return_storage_ptr__,(kj *)&local_50,local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeNodeName(Schema schema) {
  schema::Node::Reader proto = schema.getProto();
  return kj::str(proto.getDisplayName().slice(proto.getDisplayNamePrefixLength()));
}